

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

void vsencoding::__vseblocks_unpack1(uint32_t *out,uint32_t *in,uint32_t bs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  uint uVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar18 [64];
  
  if (0x1f < bs + 0x1f) {
    auVar5 = vpmovsxbd_avx2(ZEXT816(0x1718191a1b1c1d1e));
    auVar1 = vpmovsxbd_avx(ZEXT416(0x13141516));
    auVar2 = vpmovsxbd_avx(ZEXT416(0x1011));
    auVar11 = vpmovsxbd_avx512f(_DAT_00194220);
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
    auVar13 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar6 = vpmovsxbd_avx2(ZEXT816(0x8090a0b0c0d0e0f));
    auVar3 = vpmovsxbd_avx(ZEXT416(0x4050607));
    auVar4 = vpmovsxbd_avx(ZEXT416(0x102));
    auVar14 = vpmovsxbd_avx512f(_DAT_00194230);
    uVar10 = 0;
    do {
      uVar10 = uVar10 + 1;
      auVar15 = vpbroadcastd_avx512f();
      auVar8 = vpsrlvd_avx2(auVar15._0_32_,auVar6);
      auVar20 = auVar15._0_16_;
      auVar7 = vpsrlvd_avx2(auVar20,auVar3);
      auVar9 = vpsrlvd_avx2(auVar15._0_32_,auVar5);
      auVar15 = vinserti32x4_avx512f(ZEXT3264(auVar8),auVar7,2);
      auVar7 = vpsrlvd_avx2(auVar20,auVar4);
      auVar16 = vpbroadcastd_avx512f();
      auVar17._0_48_ = auVar15._0_48_;
      auVar17._48_4_ = auVar16._48_4_;
      auVar17._52_4_ = auVar15._52_4_;
      auVar17._56_4_ = auVar15._56_4_;
      auVar17._60_4_ = auVar15._60_4_;
      auVar15 = vpermt2d_avx512f(auVar17,auVar14,ZEXT1664(auVar7));
      auVar7 = vpsrlvd_avx2(auVar20,auVar1);
      auVar16 = vpermt2d_avx512f(ZEXT3264(auVar9),auVar11,ZEXT1664(auVar7));
      auVar7 = vpsrlvd_avx2(auVar20,auVar2);
      auVar20 = vpsrld_avx(auVar20,0x1f);
      auVar17 = vpbroadcastd_avx512f();
      auVar18._60_4_ = auVar17._60_4_;
      auVar18._0_60_ = auVar15._0_60_;
      auVar15 = vpbroadcastd_avx512f();
      auVar19._0_52_ = auVar16._0_52_;
      auVar19._52_4_ = auVar15._52_4_;
      auVar19._56_4_ = auVar16._56_4_;
      auVar19._60_4_ = auVar16._60_4_;
      auVar15 = vpermt2q_avx512f(auVar19,auVar12,ZEXT1664(auVar7));
      auVar15 = vpandd_avx512f(auVar15,auVar13);
      auVar16 = vinserti32x4_avx512f(ZEXT3264(auVar5),auVar20,0);
      auVar16._4_4_ = auVar15._4_4_;
      auVar16._8_4_ = auVar15._8_4_;
      auVar16._12_4_ = auVar15._12_4_;
      auVar16._16_4_ = auVar15._16_4_;
      auVar16._20_4_ = auVar15._20_4_;
      auVar16._24_4_ = auVar15._24_4_;
      auVar16._28_4_ = auVar15._28_4_;
      auVar16._32_4_ = auVar15._32_4_;
      auVar16._36_4_ = auVar15._36_4_;
      auVar16._40_4_ = auVar15._40_4_;
      auVar16._44_4_ = auVar15._44_4_;
      auVar16._48_4_ = auVar15._48_4_;
      auVar16._52_4_ = auVar15._52_4_;
      auVar16._56_4_ = auVar15._56_4_;
      auVar16._60_4_ = auVar15._60_4_;
      auVar17 = vpandd_avx512f(auVar18,auVar13);
      auVar15 = vmovdqu64_avx512f(auVar16);
      *(undefined1 (*) [64])out = auVar15;
      auVar15 = vmovdqu64_avx512f(auVar17);
      *(undefined1 (*) [64])((long)out + 0x40) = auVar15;
      out = (uint32_t *)((long)out + 0x80);
    } while (bs + 0x1f >> 5 != uVar10);
  }
  return;
}

Assistant:

void __vseblocks_unpack1(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  // for (uint32_t i = 0; i < bs; i += 32, out += 32, in += 1) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 1,
      --bs) { // remove inf-loop gcc warning (ovflw-related)
    out[0] = in[0] >> 31;
    out[1] = (in[0] >> 30) & 0x01;
    out[2] = (in[0] >> 29) & 0x01;
    out[3] = (in[0] >> 28) & 0x01;
    out[4] = (in[0] >> 27) & 0x01;
    out[5] = (in[0] >> 26) & 0x01;
    out[6] = (in[0] >> 25) & 0x01;
    out[7] = (in[0] >> 24) & 0x01;
    out[8] = (in[0] >> 23) & 0x01;
    out[9] = (in[0] >> 22) & 0x01;
    out[10] = (in[0] >> 21) & 0x01;
    out[11] = (in[0] >> 20) & 0x01;
    out[12] = (in[0] >> 19) & 0x01;
    out[13] = (in[0] >> 18) & 0x01;
    out[14] = (in[0] >> 17) & 0x01;
    out[15] = (in[0] >> 16) & 0x01;
    out[16] = (in[0] >> 15) & 0x01;
    out[17] = (in[0] >> 14) & 0x01;
    out[18] = (in[0] >> 13) & 0x01;
    out[19] = (in[0] >> 12) & 0x01;
    out[20] = (in[0] >> 11) & 0x01;
    out[21] = (in[0] >> 10) & 0x01;
    out[22] = (in[0] >> 9) & 0x01;
    out[23] = (in[0] >> 8) & 0x01;
    out[24] = (in[0] >> 7) & 0x01;
    out[25] = (in[0] >> 6) & 0x01;
    out[26] = (in[0] >> 5) & 0x01;
    out[27] = (in[0] >> 4) & 0x01;
    out[28] = (in[0] >> 3) & 0x01;
    out[29] = (in[0] >> 2) & 0x01;
    out[30] = (in[0] >> 1) & 0x01;
    out[31] = in[0] & 0x01;
  }
}